

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O2

Id_t __thiscall Potassco::SmodelsInput::NodeTab::add(NodeTab *this,StringSpan *n)

{
  Id_t IVar1;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar2;
  uint *local_60;
  undefined8 local_58;
  uint local_50 [2];
  undefined4 uStack_48;
  undefined4 uStack_44;
  uint *local_40;
  undefined8 local_38;
  uint local_30 [2];
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined4 local_20;
  
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,n->first,n->first + n->size);
  local_38 = local_58;
  local_20 = (undefined4)(this->nodes)._M_h._M_element_count;
  local_40 = local_30;
  if (local_60 == local_50) {
    uStack_28 = uStack_48;
    uStack_24 = uStack_44;
  }
  else {
    local_40 = local_60;
  }
  local_58 = 0;
  local_50[0] = local_50[0] & 0xffffff00;
  local_60 = local_50;
  pVar2 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_int>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)this);
  IVar1 = *(Id_t *)((long)pVar2.first.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                          ._M_cur.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                   + 0x28);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return IVar1;
}

Assistant:

Id_t add(const StringSpan& n) {
		return nodes.insert(StrMap::value_type(std::string(begin(n), end(n)), (Id_t)nodes.size())).first->second;
	}